

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
operator()(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           *this,basic_string_view<char> value)

{
  basic_string_view<char> s;
  size_t in_RCX;
  error_handler local_29;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *local_28;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *this_local;
  basic_string_view<char> value_local;
  
  value_local.data_ = (char *)value.size_;
  this_local = (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                *)value.data_;
  local_28 = this;
  if (this->specs_ == (format_specs *)0x0) {
    write(this,(int)value.data_,value_local.data_,in_RCX);
  }
  else {
    check_string_type_spec<char,fmt::v7::detail::error_handler>(this->specs_->type,&local_29);
    s.size_ = (size_t)value_local.data_;
    s.data_ = (char *)this_local;
    write<char>(this,s,this->specs_);
  }
  return (iterator)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

iterator operator()(basic_string_view<Char> value) {
    if (specs_) {
      check_string_type_spec(specs_->type, error_handler());
      write(value, *specs_);
    } else {
      write(value);
    }
    return out_;
  }